

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O3

void __thiscall
BPlusTree::InsertInternal
          (BPlusTree *this,float key,shared_ptr<Node> *parent,shared_ptr<Node> *child)

{
  pointer *ppsVar1;
  float key_00;
  uint32_t uVar2;
  pointer pfVar3;
  pointer pfVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  long lVar11;
  element_type *peVar12;
  difference_type __d;
  undefined1 local_150 [8];
  vector<float,_std::allocator<float>_> firstHalfKey;
  shared_ptr<Node> newRoot;
  vector<float,_std::allocator<float>_> secondHalfKey;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> firstHalfPtr;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> secondHalfPtr;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> tempPtrs;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  shared_ptr<Node> local_b8;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  shared_ptr<Node> local_98;
  undefined1 local_88 [8];
  shared_ptr<void> newPointer;
  shared_ptr<void> internalNode1Ptr;
  shared_ptr<void> internalNode2Ptr;
  vector<float,_std::allocator<float>_> tempKeys;
  float newParentKey;
  float key_local;
  
  local_88 = (undefined1  [8])(child->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (child->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count + 1
      ;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count + 1
      ;
    }
  }
  peVar12 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pfVar3 = (peVar12->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (peVar12->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = (long)pfVar4 - (long)pfVar3 >> 2;
  newParentKey = key;
  if (uVar7 < this->size) {
    if (pfVar4 != pfVar3) {
      uVar9 = 0xffffffff;
      lVar11 = 0;
      do {
        if (key < pfVar3[lVar11]) {
          iVar8 = (int)lVar11;
          goto LAB_00104e7e;
        }
        if (uVar7 - 1 == lVar11) {
          uVar9 = uVar7 & 0xffffffff;
        }
        iVar8 = (int)uVar9;
        lVar11 = lVar11 + 1;
      } while (uVar7 + (uVar7 == 0) != lVar11);
      if (iVar8 != -1) {
LAB_00104e7e:
        std::vector<float,_std::allocator<float>_>::insert
                  (&peVar12->keys,(const_iterator)(pfVar3 + iVar8),&newParentKey);
        peVar12 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::insert
                  (&peVar12->ptrs,
                   (peVar12->ptrs).
                   super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)iVar8 + 1,
                   (value_type *)local_88);
      }
    }
    goto LAB_00105256;
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010dd00;
  uVar2 = this->size;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[3]._M_use_count = 0;
  this_00[3]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  *(undefined1 *)&this_00[4]._vptr__Sp_counted_base = 0;
  *(uint32_t *)((long)&this_00[4]._vptr__Sp_counted_base + 4) = uVar2;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->keys);
  std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::vector
            ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
             &secondHalfPtr.
              super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             &((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->ptrs);
  lVar11 = (long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start -
           (long)internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi >> 2;
  if ((long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start -
      (long)internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != 0) {
    lVar10 = 0;
    do {
      if (newParentKey <
          *(float *)((long)&(internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar10 * 4)) {
LAB_00104ebe:
        std::vector<float,_std::allocator<float>_>::insert
                  ((vector<float,_std::allocator<float>_> *)
                   &internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (float *)((long)&(internalNode2Ptr.
                                     super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi)->_vptr__Sp_counted_base +
                            (long)(int)lVar10 * 4),&newParentKey);
        std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::insert
                  ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                   &secondHalfPtr.
                    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   secondHalfPtr.
                   super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)(int)lVar10 + 1,
                   (value_type *)local_88);
        lVar11 = (long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start -
                 (long)internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi >> 2;
        break;
      }
      if (lVar11 + -1 == lVar10) {
        lVar10 = lVar11;
        if ((int)((ulong)~((long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start -
                          (long)internalNode2Ptr.
                                super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                                _M_pi) >> 2) != 0) goto LAB_00104ebe;
        break;
      }
      lVar10 = lVar10 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar10);
  }
  uVar7 = lVar11 + 1U >> 1;
  std::vector<float,std::allocator<float>>::
  vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
            ((vector<float,std::allocator<float>> *)local_150,
             (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
             internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ,(float *)((long)&(internalNode2Ptr.
                                super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                               _M_pi)->_vptr__Sp_counted_base + uVar7 * 4),
             (allocator_type *)
             &newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<float,std::allocator<float>>::
  vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
            ((vector<float,std::allocator<float>> *)
             &newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (float *)((long)&(internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_vptr__Sp_counted_base + uVar7 * 4 + 4),
             (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
             tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (allocator_type *)
             &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::operator=
            (&((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->keys,
             (vector<float,_std::allocator<float>_> *)local_150);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)&this_00[2]._M_use_count,
             (vector<float,_std::allocator<float>_> *)
             &newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
  vector<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,void>
            ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)
             &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
              )secondHalfPtr.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
             secondHalfPtr.
             super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + uVar7 + 1,
             (allocator_type *)
             &firstHalfPtr.
              super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
  vector<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,void>
            ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)
             &firstHalfPtr.
              super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             secondHalfPtr.
             super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + uVar7 + 1,
             (__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
              )tempPtrs.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (allocator_type *)
             &newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator=
            (&((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->ptrs,
             (vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
             &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  peVar12 = (element_type *)(this_00 + 1);
  std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator=
            ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)peVar12,
             (vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
             &firstHalfPtr.
              super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00105005:
    if (__libc_single_threaded != '\0') goto LAB_00105011;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _M_use_count + 1;
      UNLOCK();
      goto LAB_00105005;
    }
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count
         + 1;
LAB_00105011:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  key_00 = *(float *)((long)&(internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar7 * 4);
  this->numNodes = this->numNodes + 1;
  peVar6 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar5 = (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar12;
  internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = key_00;
  if (peVar6 == peVar5) {
    newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x48);
    ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x100000001;
    ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR___Sp_counted_ptr_inplace_0010dd00;
    ppsVar1 = &((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar2 = this->size;
    (newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->isLeaf = false;
    *(undefined3 *)
     &(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->field_0x31 = 0;
    (newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size = 0;
    newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].ptrs.
    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->keys).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->keys).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->keys).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    *(undefined1 *)
     &newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].ptrs.
      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    *(uint32_t *)
     ((long)&newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].ptrs.
             super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = uVar2;
    this->numNodes = this->numNodes + 1;
    firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)ppsVar1;
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)
               &((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->keys).
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,(iterator)0x0,
               (float *)((long)&tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)ppsVar1,
               (value_type *)
               &newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)ppsVar1,
               (value_type *)
               &internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)ppsVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newRoot);
    this_01._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    local_b8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((element_type *)
        local_b8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppsVar1 = &(((element_type *)
                    local_b8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                   ->ptrs).
                   super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
        UNLOCK();
        peVar6 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      else {
        ppsVar1 = &(((element_type *)
                    local_b8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                   ->ptrs).
                   super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
      }
    }
    local_a0 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_a0->_M_use_count = local_a0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_a0->_M_use_count = local_a0->_M_use_count + 1;
      }
    }
    local_b8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    local_a8 = peVar6;
    FindParent((BPlusTree *)
               &tempPtrs.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&this->root,&local_b8);
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_98.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
    local_98.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    InsertInternal(this,key_00,
                   (shared_ptr<Node> *)
                   &tempPtrs.
                    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_98);
    if (local_98.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    this_01._M_pi = local_b8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
      this_01._M_pi =
           local_b8.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  if ((element_type *)this_01._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               internalNode1Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
            ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
             &firstHalfPtr.
              super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
            ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
             &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_150 != (undefined1  [8])0x0) {
    operator_delete((void *)local_150);
  }
  std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
            ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
             &secondHalfPtr.
              super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_00105256:
  if (newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void BPlusTree::InsertInternal(float key, std::shared_ptr<Node> parent, std::shared_ptr<Node> child) {
    std::shared_ptr<void> newPointer(child);

    // parent still have space
    if (parent->keys.size() < size) {
        int insertPos = -1;
        for (int i = 0; i < parent->keys.size(); i++) {
            if (key < parent->keys[i]) {
                insertPos = i;
                break;
            }

            if (i == parent->keys.size()-1) {
                insertPos = parent->keys.size();
            }
        }

        if (insertPos != -1) {
            // insert key in vector
            std::vector<float>::iterator keyInsertItr = parent->keys.begin() + insertPos;
            parent->keys.insert(keyInsertItr, key);

            // insert ptr in vector
            std::vector<std::shared_ptr<void>>::iterator ptrInsertItr = parent->ptrs.begin() + insertPos + 1;
            parent->ptrs.insert(ptrInsertItr, newPointer);
        }
    } else {
        // parent does not have space, split the parent node into 2
        std::shared_ptr<Node> newInternalNode = std::make_shared<Node>(false, size);

        std::vector<float> tempKeys(parent->keys);
        std::vector<std::shared_ptr<void>> tempPtrs(parent->ptrs);

        // insert into temp key & ptr
        int insertPos = -1;
        for (int i = 0; i < tempKeys.size(); i++) {
            if (key < tempKeys[i]) {
                insertPos = i;
                break;
            }

            if (i == tempKeys.size()-1) {
                insertPos = tempKeys.size();
                break;
            }
        }

        if (insertPos != -1) {
            // insert key in vector
            std::vector<float>::iterator keyInsertItr = tempKeys.begin() + insertPos;
            tempKeys.insert(keyInsertItr, key);

            // insert ptr in vector
            std::vector<std::shared_ptr<void>>::iterator ptrInsertItr = tempPtrs.begin() + insertPos + 1;
            tempPtrs.insert(ptrInsertItr, newPointer);
        }

        // split temp key & ptr
        std::size_t splitSize = (tempKeys.size() + 1)/2;
        std::vector<float> firstHalfKey(tempKeys.cbegin(), tempKeys.cbegin() + splitSize);
        std::vector<float> secondHalfKey(tempKeys.cbegin() + splitSize + 1, tempKeys.cend());    // +1 becuase for the second half dont need the first key

        parent->keys = firstHalfKey;
        newInternalNode->keys = secondHalfKey;

        std::vector<std::shared_ptr<void>>::const_iterator splitIter(tempPtrs.cbegin());
        std::advance(splitIter, splitSize);

        std::vector<std::shared_ptr<void>> firstHalfPtr(tempPtrs.cbegin(), splitIter + 1);
        std::vector<std::shared_ptr<void>> secondHalfPtr(splitIter + 1, tempPtrs.cend());

        parent->ptrs = firstHalfPtr;
        newInternalNode->ptrs = secondHalfPtr;

        std::shared_ptr<void> internalNode1Ptr(parent);
        std::shared_ptr<void> internalNode2Ptr(newInternalNode);
        float newParentKey = tempKeys[splitSize];
        numNodes++;

        if (parent == root) {
            std::shared_ptr<Node> newRoot = std::make_shared<Node>(false, size);
            numNodes++;
            newRoot->keys.push_back(newParentKey);
            newRoot->ptrs.push_back(internalNode1Ptr);
            newRoot->ptrs.push_back(internalNode2Ptr);
            root = newRoot;
        } else {
            InsertInternal(newParentKey, FindParent(root, parent), newInternalNode);
        }
    }
}